

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void btreeblk_write_done(void *voidhandle,bid_t bid)

{
  btreeblk_block *block_00;
  avl_node *in_RSI;
  btreeblk_handle *in_RDI;
  fdb_status status;
  int writable;
  btreeblk_block *block;
  list_elem *e;
  btreeblk_handle *handle;
  btreeblk_block *in_stack_ffffffffffffffb8;
  btreeblk_handle *in_stack_ffffffffffffffc0;
  fdb_status in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  avl_node *file;
  
  block_00 = (btreeblk_block *)list_begin(&in_RDI->alc_list);
  while( true ) {
    while( true ) {
      if (block_00 == (btreeblk_block *)0x0) {
        return;
      }
      file = &block_00[-1].avl;
      if (file->parent == in_RSI) break;
      block_00 = (btreeblk_block *)list_next((list_elem *)block_00);
    }
    in_stack_ffffffffffffffd4 =
         filemgr_is_writable((filemgr *)file,
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (in_stack_ffffffffffffffd4 == 0) break;
    in_stack_ffffffffffffffd0 = _btreeblk_write_dirty_block(in_RDI,block_00);
    if (in_stack_ffffffffffffffd0 != FDB_RESULT_SUCCESS) {
      return;
    }
    block_00 = (btreeblk_block *)list_remove(&in_RDI->alc_list,(list_elem *)((long)(file + 1) + 8));
    _btreeblk_free_dirty_block(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  fdb_log_impl((err_log_callback *)0x0,1,FDB_RESULT_WRITE_FAIL,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/btreeblock.cc"
               ,"btreeblk_write_done",0x3cb,"b+tree node write fail, BID %zu, file %s",file->parent,
               in_RDI->file->filename);
  return;
}

Assistant:

void btreeblk_write_done(void* voidhandle, bid_t bid) {
    // flush and write the block for given BID in the allocation list.
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;

    // write and free items in allocation list
    struct list_elem *e = list_begin(&handle->alc_list);
    while (e) {
        struct btreeblk_block *block = _get_entry(e, struct btreeblk_block, le);
        if (block->bid != bid) {
            e = list_next(e);
            continue;
        }
        int writable = filemgr_is_writable(handle->file, block->bid);
        if (writable) {
            fdb_status status = _btreeblk_write_dirty_block(handle, block);
            if (status != FDB_RESULT_SUCCESS) {
                return;
            }
        } else {
            fdb_log(nullptr, FDB_LOG_FATAL,
                    FDB_RESULT_WRITE_FAIL,
                    "b+tree node write fail, BID %zu, file %s",
                    block->bid,
                    handle->file->filename);
            return;
        }

        e = list_remove(&handle->alc_list, &block->le);
        _btreeblk_free_dirty_block(handle, block);
    }
}